

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
hedg::utils::get_ids
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,
          queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
          *market_ids,
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          *subscribed,int max_markets)

{
  uint uVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ppVar2
  ;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  string id_string;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  bVar5 = (market_ids->c).
          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (market_ids->c).
          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (bVar5) {
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append
              ((char *)&local_58,
               (ulong)(((market_ids->c).
                        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->first)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_58);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::push_back(subscribed,
                (market_ids->c).
                super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
    max_markets = max_markets + -1;
  }
  uVar4 = (uint)bVar5;
  local_38 = __return_storage_ptr__;
  if ((market_ids->c).
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (market_ids->c).
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar1 = max_markets + uVar4;
    uVar3 = uVar4;
    do {
      bVar5 = max_markets == 0;
      max_markets = max_markets + -1;
      uVar4 = uVar1;
      if (bVar5) break;
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append
                ((char *)&local_58,
                 (ulong)(((market_ids->c).
                          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->first)._M_dataplus._M_p)
      ;
      std::__cxx11::string::append((char *)&local_58);
      std::
      deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ::push_back(subscribed,
                  (market_ids->c).
                  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ::pop_front(&market_ids->c);
      uVar4 = uVar3 + 1;
      uVar3 = uVar4;
    } while ((market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  while (ppVar2 = local_38,
        (market_ids->c).
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (market_ids->c).
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
  }
  (local_38->first)._M_dataplus._M_p = (pointer)&(local_38->first).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,local_58,local_58 + local_50);
  ppVar2->second = uVar4;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return ppVar2;
}

Assistant:

FMT_FUNC std::system_error vsystem_error(int error_code, string_view format_str,
                                         format_args args) {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(format_str, args));
}